

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerline.cc
# Opt level: O1

void powerline(ostringstream *oss,char *color,POWERLINE_DIRECTION direction,bool background_only)

{
  size_t sVar1;
  ostream *poVar2;
  char *pcVar3;
  string colorstr;
  char *local_58;
  long local_50;
  char local_48 [16];
  string local_38;
  undefined7 uStack_37;
  undefined1 local_28 [16];
  
  if (direction == POWERLINE_RIGHT) {
    local_38 = (string)0x20;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,(char *)&local_38,1);
    pcVar3 = strchr(color,0x2c);
    bg2fg::buf[0] = '#';
    bg2fg::buf[1] = '[';
    bg2fg::buf[2] = 'f';
    strcpy(bg2fg::buf + 3,pcVar3 + 2);
    sVar1 = strlen(bg2fg::buf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,bg2fg::buf,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_c0b5,3);
    if (color == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      return;
    }
  }
  else {
    if (direction != POWERLINE_LEFT) {
      if (direction != NONE) {
        return;
      }
      if (color == (char *)0x0) {
        std::ios::clear((int)oss + (int)*(undefined8 *)(*(long *)oss + -0x18));
        return;
      }
      sVar1 = strlen(color);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,color,sVar1);
      return;
    }
    if (!background_only) {
      std::__cxx11::string::string(&local_38,color,(allocator *)&local_58);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,"#[",2);
      std::__cxx11::string::find((char *)&local_38,0x106f15,0);
      std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_38);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_c09f,3);
      if (color == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar1 = strlen(color);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,color,sVar1);
      }
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if ((undefined1 *)CONCAT71(uStack_37,local_38) == local_28) {
        return;
      }
      operator_delete((undefined1 *)CONCAT71(uStack_37,local_38));
      return;
    }
    local_38 = (string)0x20;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)oss,(char *)&local_38,1);
    pcVar3 = strchr(color,0x2c);
    bg2fg::buf[0] = '#';
    bg2fg::buf[1] = '[';
    color = bg2fg::buf;
    bg2fg::buf[2] = 'f';
    strcpy(bg2fg::buf + 3,pcVar3 + 2);
  }
  sVar1 = strlen(color);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,color,sVar1);
  return;
}

Assistant:

void powerline( std::ostringstream & oss, const char color[],
  POWERLINE_DIRECTION direction, bool background_only )
{
  switch( direction )
    {
  case NONE:
    oss << color;
    break;
  case POWERLINE_LEFT:
    if( background_only )
      {
      oss << ' ' << bg2fg( color );
      }
    else
      {
      std::string colorstr( color );
      oss << "#[" << colorstr.substr( colorstr.find( "," ) + 1 )
          << PWL_LEFT_FILLED
          << color;
      }
    break;
  case POWERLINE_RIGHT:
    oss << ' '
        << bg2fg( color )
        << PWL_RIGHT_FILLED
        << color;
    break;
    };
}